

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void ModulusHelper<long_long,unsigned_int,2>::
     ModulusThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (longlong *t,uint *u,longlong *result)

{
  bool bVar1;
  long *in_RDX;
  uint *in_RSI;
  long *in_RDI;
  
  if (*in_RSI == 0) {
    safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
  }
  bVar1 = mod_corner_case<unsigned_int,_false>::is_undefined(*in_RSI);
  if (bVar1) {
    *in_RDX = 0;
  }
  else {
    *in_RDX = *in_RDI % (long)(ulong)*in_RSI;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        if (mod_corner_case<U, std::numeric_limits< U >::is_signed >::is_undefined(u))
        {
            result = 0;
            return;
        }

        result = (T)((std::int64_t)t % (std::int64_t)u);
    }